

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtfmtsym.cpp
# Opt level: O0

void __thiscall
icu_63::DateFormatSymbols::setWeekdays
          (DateFormatSymbols *this,UnicodeString *weekdaysArray,int32_t count,DtContextType context,
          DtWidthType width)

{
  UnicodeString *pUVar1;
  UnicodeString *pUVar2;
  UnicodeString *pUVar3;
  DtWidthType width_local;
  DtContextType context_local;
  int32_t count_local;
  UnicodeString *weekdaysArray_local;
  DateFormatSymbols *this_local;
  
  if (context == FORMAT) {
    switch(width) {
    case ABBREVIATED:
      if ((this->fShortWeekdays != (UnicodeString *)0x0) &&
         (pUVar2 = this->fShortWeekdays, pUVar2 != (UnicodeString *)0x0)) {
        pUVar1 = pUVar2 + *(long *)((long)&pUVar2[-1].fUnion + 0x30);
        pUVar3 = weekdaysArray;
        while (pUVar2 != pUVar1) {
          pUVar1 = pUVar1 + -1;
          icu_63::UnicodeString::~UnicodeString(pUVar1);
        }
        UMemory::operator_delete__((UMemory *)((long)&pUVar2[-1].fUnion + 0x30),pUVar3);
      }
      pUVar2 = newUnicodeStringArray((long)count);
      this->fShortWeekdays = pUVar2;
      uprv_arrayCopy(weekdaysArray,this->fShortWeekdays,count);
      this->fShortWeekdaysCount = count;
      break;
    case WIDE:
      if ((this->fWeekdays != (UnicodeString *)0x0) &&
         (pUVar2 = this->fWeekdays, pUVar2 != (UnicodeString *)0x0)) {
        pUVar1 = pUVar2 + *(long *)((long)&pUVar2[-1].fUnion + 0x30);
        pUVar3 = weekdaysArray;
        while (pUVar2 != pUVar1) {
          pUVar1 = pUVar1 + -1;
          icu_63::UnicodeString::~UnicodeString(pUVar1);
        }
        UMemory::operator_delete__((UMemory *)((long)&pUVar2[-1].fUnion + 0x30),pUVar3);
      }
      pUVar2 = newUnicodeStringArray((long)count);
      this->fWeekdays = pUVar2;
      uprv_arrayCopy(weekdaysArray,this->fWeekdays,count);
      this->fWeekdaysCount = count;
      break;
    case NARROW:
      if ((this->fNarrowWeekdays != (UnicodeString *)0x0) &&
         (pUVar2 = this->fNarrowWeekdays, pUVar2 != (UnicodeString *)0x0)) {
        pUVar1 = pUVar2 + *(long *)((long)&pUVar2[-1].fUnion + 0x30);
        pUVar3 = weekdaysArray;
        while (pUVar2 != pUVar1) {
          pUVar1 = pUVar1 + -1;
          icu_63::UnicodeString::~UnicodeString(pUVar1);
        }
        UMemory::operator_delete__((UMemory *)((long)&pUVar2[-1].fUnion + 0x30),pUVar3);
      }
      pUVar2 = newUnicodeStringArray((long)count);
      this->fNarrowWeekdays = pUVar2;
      uprv_arrayCopy(weekdaysArray,this->fNarrowWeekdays,count);
      this->fNarrowWeekdaysCount = count;
      break;
    case SHORT:
      if ((this->fShorterWeekdays != (UnicodeString *)0x0) &&
         (pUVar2 = this->fShorterWeekdays, pUVar2 != (UnicodeString *)0x0)) {
        pUVar1 = pUVar2 + *(long *)((long)&pUVar2[-1].fUnion + 0x30);
        pUVar3 = weekdaysArray;
        while (pUVar2 != pUVar1) {
          pUVar1 = pUVar1 + -1;
          icu_63::UnicodeString::~UnicodeString(pUVar1);
        }
        UMemory::operator_delete__((UMemory *)((long)&pUVar2[-1].fUnion + 0x30),pUVar3);
      }
      pUVar2 = newUnicodeStringArray((long)count);
      this->fShorterWeekdays = pUVar2;
      uprv_arrayCopy(weekdaysArray,this->fShorterWeekdays,count);
      this->fShorterWeekdaysCount = count;
      break;
    case DT_WIDTH_COUNT:
    }
  }
  else if (context == STANDALONE) {
    switch(width) {
    case ABBREVIATED:
      if ((this->fStandaloneShortWeekdays != (UnicodeString *)0x0) &&
         (pUVar2 = this->fStandaloneShortWeekdays, pUVar2 != (UnicodeString *)0x0)) {
        pUVar1 = pUVar2 + *(long *)((long)&pUVar2[-1].fUnion + 0x30);
        pUVar3 = weekdaysArray;
        while (pUVar2 != pUVar1) {
          pUVar1 = pUVar1 + -1;
          icu_63::UnicodeString::~UnicodeString(pUVar1);
        }
        UMemory::operator_delete__((UMemory *)((long)&pUVar2[-1].fUnion + 0x30),pUVar3);
      }
      pUVar2 = newUnicodeStringArray((long)count);
      this->fStandaloneShortWeekdays = pUVar2;
      uprv_arrayCopy(weekdaysArray,this->fStandaloneShortWeekdays,count);
      this->fStandaloneShortWeekdaysCount = count;
      break;
    case WIDE:
      if ((this->fStandaloneWeekdays != (UnicodeString *)0x0) &&
         (pUVar2 = this->fStandaloneWeekdays, pUVar2 != (UnicodeString *)0x0)) {
        pUVar1 = pUVar2 + *(long *)((long)&pUVar2[-1].fUnion + 0x30);
        pUVar3 = weekdaysArray;
        while (pUVar2 != pUVar1) {
          pUVar1 = pUVar1 + -1;
          icu_63::UnicodeString::~UnicodeString(pUVar1);
        }
        UMemory::operator_delete__((UMemory *)((long)&pUVar2[-1].fUnion + 0x30),pUVar3);
      }
      pUVar2 = newUnicodeStringArray((long)count);
      this->fStandaloneWeekdays = pUVar2;
      uprv_arrayCopy(weekdaysArray,this->fStandaloneWeekdays,count);
      this->fStandaloneWeekdaysCount = count;
      break;
    case NARROW:
      if ((this->fStandaloneNarrowWeekdays != (UnicodeString *)0x0) &&
         (pUVar2 = this->fStandaloneNarrowWeekdays, pUVar2 != (UnicodeString *)0x0)) {
        pUVar1 = pUVar2 + *(long *)((long)&pUVar2[-1].fUnion + 0x30);
        pUVar3 = weekdaysArray;
        while (pUVar2 != pUVar1) {
          pUVar1 = pUVar1 + -1;
          icu_63::UnicodeString::~UnicodeString(pUVar1);
        }
        UMemory::operator_delete__((UMemory *)((long)&pUVar2[-1].fUnion + 0x30),pUVar3);
      }
      pUVar2 = newUnicodeStringArray((long)count);
      this->fStandaloneNarrowWeekdays = pUVar2;
      uprv_arrayCopy(weekdaysArray,this->fStandaloneNarrowWeekdays,count);
      this->fStandaloneNarrowWeekdaysCount = count;
      break;
    case SHORT:
      if ((this->fStandaloneShorterWeekdays != (UnicodeString *)0x0) &&
         (pUVar2 = this->fStandaloneShorterWeekdays, pUVar2 != (UnicodeString *)0x0)) {
        pUVar1 = pUVar2 + *(long *)((long)&pUVar2[-1].fUnion + 0x30);
        pUVar3 = weekdaysArray;
        while (pUVar2 != pUVar1) {
          pUVar1 = pUVar1 + -1;
          icu_63::UnicodeString::~UnicodeString(pUVar1);
        }
        UMemory::operator_delete__((UMemory *)((long)&pUVar2[-1].fUnion + 0x30),pUVar3);
      }
      pUVar2 = newUnicodeStringArray((long)count);
      this->fStandaloneShorterWeekdays = pUVar2;
      uprv_arrayCopy(weekdaysArray,this->fStandaloneShorterWeekdays,count);
      this->fStandaloneShorterWeekdaysCount = count;
      break;
    case DT_WIDTH_COUNT:
    }
  }
  return;
}

Assistant:

void
DateFormatSymbols::setWeekdays(const UnicodeString* weekdaysArray, int32_t count, DtContextType context, DtWidthType width)
{
    // delete the old list if we own it
    // we always own the new list, which we create here (we duplicate rather
    // than adopting the list passed in)

    switch (context) {
    case FORMAT :
        switch (width) {
        case WIDE :
            if (fWeekdays)
                delete[] fWeekdays;
            fWeekdays = newUnicodeStringArray(count);
            uprv_arrayCopy(weekdaysArray, fWeekdays, count);
            fWeekdaysCount = count;
            break;
        case ABBREVIATED :
            if (fShortWeekdays)
                delete[] fShortWeekdays;
            fShortWeekdays = newUnicodeStringArray(count);
            uprv_arrayCopy(weekdaysArray, fShortWeekdays, count);
            fShortWeekdaysCount = count;
            break;
        case SHORT :
            if (fShorterWeekdays)
                delete[] fShorterWeekdays;
            fShorterWeekdays = newUnicodeStringArray(count);
            uprv_arrayCopy(weekdaysArray, fShorterWeekdays, count);
            fShorterWeekdaysCount = count;
            break;
        case NARROW :
            if (fNarrowWeekdays)
                delete[] fNarrowWeekdays;
            fNarrowWeekdays = newUnicodeStringArray(count);
            uprv_arrayCopy(weekdaysArray, fNarrowWeekdays, count);
            fNarrowWeekdaysCount = count;
            break;
        case DT_WIDTH_COUNT :
            break;
        }
        break;
    case STANDALONE :
        switch (width) {
        case WIDE :
            if (fStandaloneWeekdays)
                delete[] fStandaloneWeekdays;
            fStandaloneWeekdays = newUnicodeStringArray(count);
            uprv_arrayCopy(weekdaysArray, fStandaloneWeekdays, count);
            fStandaloneWeekdaysCount = count;
            break;
        case ABBREVIATED :
            if (fStandaloneShortWeekdays)
                delete[] fStandaloneShortWeekdays;
            fStandaloneShortWeekdays = newUnicodeStringArray(count);
            uprv_arrayCopy(weekdaysArray, fStandaloneShortWeekdays, count);
            fStandaloneShortWeekdaysCount = count;
            break;
        case SHORT :
            if (fStandaloneShorterWeekdays)
                delete[] fStandaloneShorterWeekdays;
            fStandaloneShorterWeekdays = newUnicodeStringArray(count);
            uprv_arrayCopy(weekdaysArray, fStandaloneShorterWeekdays, count);
            fStandaloneShorterWeekdaysCount = count;
            break;
        case NARROW :
            if (fStandaloneNarrowWeekdays)
                delete[] fStandaloneNarrowWeekdays;
            fStandaloneNarrowWeekdays = newUnicodeStringArray(count);
            uprv_arrayCopy(weekdaysArray, fStandaloneNarrowWeekdays, count);
            fStandaloneNarrowWeekdaysCount = count;
            break;
        case DT_WIDTH_COUNT :
            break;
        }
        break;
    case DT_CONTEXT_COUNT :
        break;
    }
}